

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcpuid_util.c
# Opt level: O0

void debugf(int verboselevel,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_4e8 [16];
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined4 local_438;
  undefined4 local_434;
  va_list va;
  char local_418 [8];
  char buff [1024];
  char *format_local;
  int verboselevel_local;
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  if ((_warn_fun != (libcpuid_warn_fn_t)0x0) && (verboselevel <= _current_verboselevel)) {
    va[0].overflow_arg_area = local_4e8;
    va[0]._0_8_ = &stack0x00000008;
    local_434 = 0x30;
    local_438 = 0x10;
    local_4d8 = in_RDX;
    local_4d0 = in_RCX;
    local_4c8 = in_R8;
    local_4c0 = in_R9;
    buff._1016_8_ = format;
    vsnprintf(local_418,0x400,format,&local_438);
    (*_warn_fun)(local_418);
  }
  return;
}

Assistant:

void debugf(int verboselevel, const char* format, ...)
{
	char buff[1024];
	va_list va;
	if (!_warn_fun || (verboselevel > _current_verboselevel)) return;
	va_start(va, format);
	vsnprintf(buff, sizeof(buff), format, va);
	va_end(va);
	_warn_fun(buff);
}